

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr.hpp
# Opt level: O0

void __thiscall
duckdb::unique_ptr<char[],std::default_delete<char>,false>::
unique_ptr<char*,std::default_delete<char[]>,void,bool>
          (unique_ptr<char[],_std::default_delete<char>,_false> *this,char *param_2)

{
  unique_ptr<char[],_std::default_delete<char[]>_> *in_RSI;
  char *in_stack_ffffffffffffffe8;
  
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static inline void AssertNotNull(const bool null) {
#if defined(DUCKDB_DEBUG_NO_SAFETY) || defined(DUCKDB_CLANG_TIDY)
		return;
#else
		if (DUCKDB_UNLIKELY(null)) {
			throw duckdb::InternalException("Attempted to dereference unique_ptr that is NULL!");
		}
#endif
	}